

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockets.c
# Opt level: O2

int receive(int connection,void *buffer,int size,int busy_waiting)

{
  ssize_t sVar1;
  int *piVar2;
  size_t __n;
  int iVar3;
  
  __n = (size_t)size;
  if (busy_waiting == 0) {
    sVar1 = recv(connection,buffer,__n,0);
    if (sVar1 < (long)__n) {
      iVar3 = -1;
    }
    else {
LAB_00102d94:
      iVar3 = 0;
    }
  }
  else {
    iVar3 = -1;
    do {
      sVar1 = recv(connection,buffer,__n,0);
      if ((long)__n <= sVar1) goto LAB_00102d94;
      piVar2 = __errno_location();
    } while (*piVar2 == 0xb);
  }
  return iVar3;
}

Assistant:

int receive(int connection, void* buffer, int size, int busy_waiting) {
	if (busy_waiting) {
		while (recv(connection, buffer, size, 0) < size) {
			if (errno != EAGAIN) return -1;
		}
	} else if (recv(connection, buffer, size, 0) < size) {
		return -1;
	}

	return 0;
}